

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O0

void __thiscall
OmegaSN::OmegaSN(OmegaSN *this,vector<double,_std::allocator<double>_> *values,double firstdata,
                uint nbSeg,uint n)

{
  size_type sVar1;
  double *pdVar2;
  reference pvVar3;
  double **ppdVar4;
  double ***pppdVar5;
  uint ***pppuVar6;
  uint **ppuVar7;
  uint *puVar8;
  uint local_44;
  uint local_40;
  uint j;
  uint i_2;
  uint i_1;
  uint i;
  uint n_local;
  uint nbSeg_local;
  double firstdata_local;
  vector<double,_std::allocator<double>_> *values_local;
  OmegaSN *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->changepoints);
  std::vector<double,_std::allocator<double>_>::vector(&this->parameters);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
  this->nbStates = (uint)sVar1;
  this->nbSegments = nbSeg;
  pdVar2 = (double *)operator_new__((ulong)this->nbStates << 3);
  this->states = pdVar2;
  for (i_2 = 0; i_2 < this->nbStates; i_2 = i_2 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,(ulong)i_2);
    this->states[i_2] = *pvVar3;
  }
  ppdVar4 = (double **)operator_new__(0x18);
  this->S12P = ppdVar4;
  for (j = 0; j < 3; j = j + 1) {
    pdVar2 = (double *)operator_new__((ulong)(n + 1) << 3);
    this->S12P[j] = pdVar2;
  }
  pppdVar5 = (double ***)operator_new__((ulong)this->nbSegments << 3);
  this->Q = pppdVar5;
  pppuVar6 = (uint ***)operator_new__((ulong)this->nbSegments << 3);
  this->lastChpt = pppuVar6;
  pppuVar6 = (uint ***)operator_new__((ulong)this->nbSegments << 3);
  this->lastIndState = pppuVar6;
  for (local_40 = 0; local_40 < this->nbSegments; local_40 = local_40 + 1) {
    ppdVar4 = (double **)operator_new__((ulong)this->nbStates << 3);
    this->Q[local_40] = ppdVar4;
    ppuVar7 = (uint **)operator_new__((ulong)this->nbStates << 3);
    this->lastChpt[local_40] = ppuVar7;
    ppuVar7 = (uint **)operator_new__((ulong)this->nbStates << 3);
    this->lastIndState[local_40] = ppuVar7;
    for (local_44 = 0; local_44 < this->nbStates; local_44 = local_44 + 1) {
      pdVar2 = (double *)operator_new__((ulong)(n + 1) << 3);
      this->Q[local_40][local_44] = pdVar2;
      puVar8 = (uint *)operator_new__((ulong)(n + 1) << 2);
      this->lastChpt[local_40][local_44] = puVar8;
      puVar8 = (uint *)operator_new__((ulong)(n + 1) << 2);
      this->lastIndState[local_40][local_44] = puVar8;
    }
  }
  return;
}

Assistant:

OmegaSN::OmegaSN(std::vector< double >& values, double firstdata, unsigned int nbSeg, unsigned int n)
{
  nbStates = values.size();
  nbSegments = nbSeg;
  states = new double[nbStates];
  for(unsigned int i = 0; i < nbStates; i++){states[i] = values[i];}

  ///
  /// MATRIX INITIALIZATION
  ///
  S12P = new double*[3]; ///matrix of vectors S1, S2 and SP
  for(unsigned int i = 0; i < 3; i++){S12P[i] = new double[n + 1];}

  Q = new double**[nbSegments];
  lastChpt = new unsigned int**[nbSegments];
  lastIndState = new unsigned int**[nbSegments];

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    Q[i] = new double*[nbStates];
    lastChpt[i] = new unsigned int*[nbStates];
    lastIndState[i] = new unsigned int*[nbStates];
    for(unsigned int j = 0; j < nbStates; j++)
    {
      Q[i][j] = new double[n + 1];
      lastChpt[i][j] = new unsigned int[n + 1];
      lastIndState[i][j] = new unsigned int[n + 1];
    }
  }
}